

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O2

int WebPEncode(WebPConfig *config,WebPPicture *pic)

{
  WebPAuxStats *pWVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  VP8Encoder *enc;
  VP8MBInfo *pVVar8;
  LFStats *paadVar9;
  VP8RDLevel VVar10;
  int (*paiVar11) [4];
  ulong uVar12;
  long lVar13;
  int (*paiVar14) [4];
  int iVar15;
  WebPAuxStats *stats;
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  uint8_t *puVar23;
  DError *paaiVar24;
  WebPConfig *config_1;
  bool bVar25;
  float fVar26;
  int local_38;
  
  if (pic == (WebPPicture *)0x0) {
    return 0;
  }
  pic->error_code = VP8_ENC_OK;
  if (config == (WebPConfig *)0x0) {
    pic->error_code = VP8_ENC_ERROR_NULL_PARAMETER;
    return 0;
  }
  iVar3 = WebPValidateConfig(config);
  if (iVar3 == 0) {
    if (pic->error_code != VP8_ENC_OK) {
      return 0;
    }
    pic->error_code = VP8_ENC_ERROR_INVALID_CONFIGURATION;
    return 0;
  }
  iVar3 = WebPValidatePicture(pic);
  if (iVar3 == 0) {
    return 0;
  }
  if ((0x3fff < pic->width) || (0x3fff < pic->height)) {
    if (pic->error_code != VP8_ENC_OK) {
      return 0;
    }
    pic->error_code = VP8_ENC_ERROR_BAD_DIMENSION;
    return 0;
  }
  if (pic->stats != (WebPAuxStats *)0x0) {
    memset(pic->stats,0,0xbc);
  }
  if (config->lossless != 0) {
    if ((pic->argb == (uint32_t *)0x0) && (iVar3 = WebPPictureYUVAToARGB(pic), iVar3 == 0)) {
      return 0;
    }
    if (config->exact == 0) {
      WebPReplaceTransparentPixels(pic,0);
    }
    iVar3 = VP8LEncodeImage(config,pic);
    return iVar3;
  }
  if ((((pic->use_argb != 0) || (pic->y == (uint8_t *)0x0)) || (pic->u == (uint8_t *)0x0)) ||
     (pic->v == (uint8_t *)0x0)) {
    if ((config->use_sharp_yuv == 0) && ((config->preprocessing & 4U) == 0)) {
      fVar26 = 0.0;
      if ((config->preprocessing & 2U) != 0) {
        fVar26 = config->quality / 100.0;
        fVar26 = fVar26 * fVar26;
        fVar26 = fVar26 * -0.5 * fVar26 + 1.0;
      }
      iVar3 = WebPPictureARGBToYUVADithered(pic,WEBP_YUV420,fVar26);
    }
    else {
      iVar3 = WebPPictureSharpARGBToYUVA(pic);
    }
    if (iVar3 == 0) {
      return 0;
    }
  }
  if (config->exact == 0) {
    WebPCleanupTransparentArea(pic);
  }
  iVar3 = config->filter_strength;
  iVar6 = config->autofilter;
  lVar13 = 0x81f;
  if (iVar6 == 0) {
    lVar13 = 0;
  }
  uVar12 = (long)pic->width + 0xf;
  iVar19 = (int)uVar12 >> 4;
  iVar15 = pic->height + 0xf >> 4;
  iVar20 = iVar19 * 4 + 1;
  lVar21 = (long)((iVar15 * 4 + 1) * iVar20);
  uVar12 = uVar12 & 0xfffffffffffffff0;
  lVar16 = (long)iVar19;
  iVar4 = iVar15 * iVar19;
  lVar22 = (long)iVar4;
  lVar18 = uVar12 * 2;
  if ((config->quality <= 98.0) || (1 < config->pass)) {
    lVar17 = lVar16 << 2;
  }
  else {
    lVar17 = 0;
  }
  enc = (VP8Encoder *)
        WebPSafeMalloc(lVar17 + lVar18 + lVar13 + lVar16 * 4 + lVar22 * 4 + lVar21 + 0x5cf9,1);
  if (enc == (VP8Encoder *)0x0) {
    if (pic->error_code != VP8_ENC_OK) {
      return 0;
    }
    pic->error_code = VP8_ENC_ERROR_OUT_OF_MEMORY;
    return 0;
  }
  pVVar8 = (VP8MBInfo *)((ulong)((long)&enc[1].filter_hdr.i4x4_lf_delta + 3U) & 0xffffffffffffffe0);
  memset(enc,0,0x5c98);
  uVar7 = 1;
  enc->num_parts = 1 << ((byte)config->partitions & 0x1f);
  enc->mb_w = iVar19;
  enc->mb_h = iVar15;
  enc->preds_w = iVar20;
  enc->mb_info = pVVar8;
  enc->preds = &pVVar8[lVar22].alpha + iVar20;
  enc->nz = (uint32_t *)((ulong)(&pVVar8[lVar22 + 7].field_0x3 + lVar21) & 0xffffffffffffffe0 | 4);
  paadVar9 = (LFStats *)0x0;
  if (iVar6 != 0) {
    paadVar9 = (LFStats *)
               ((ulong)(&pVVar8[lVar22 + lVar16 + 0x10].field_0x2 + lVar21) & 0xffffffffffffffe0);
  }
  enc->lf_stats = paadVar9;
  puVar23 = (uint8_t *)
            ((ulong)(&pVVar8[lVar22 + lVar16 + 0x10].field_0x2 + lVar21 + lVar13) &
            0xffffffffffffffe0);
  enc->y_top = puVar23;
  local_38 = (int)uVar12;
  paaiVar24 = (DError *)(puVar23 + lVar18);
  if (lVar17 == 0) {
    paaiVar24 = (DError *)0x0;
  }
  enc->uv_top = puVar23 + local_38;
  enc->top_derr = paaiVar24;
  enc->config = config;
  if (iVar3 < 1 && iVar6 < 1) {
    uVar5 = 2;
  }
  else {
    uVar5 = (uint)(config->filter_type != 1);
  }
  enc->profile = uVar5;
  enc->pic = pic;
  iVar3 = config->method;
  iVar6 = 100 - config->partition_limit;
  enc->method = iVar3;
  if (iVar3 < 6) {
    if (iVar3 == 5) {
      VVar10 = RD_OPT_TRELLIS;
    }
    else {
      VVar10 = (VP8RDLevel)(2 < iVar3);
    }
  }
  else {
    VVar10 = RD_OPT_TRELLIS_ALL;
  }
  enc->rd_opt_level = VVar10;
  enc->max_i4_header_bits = (uint)(iVar6 * iVar6 * 0x10000) / 10000;
  enc->mb_header_limit = (int)(0x3fc00000 / (long)iVar4);
  enc->thread_level = config->thread_level;
  if (config->target_size < 1) {
    uVar7 = (uint)(0.0 < config->target_PSNR);
  }
  enc->do_search = uVar7;
  if ((config->low_memory == 0) &&
     (enc->use_tokens = (uint)(VVar10 != RD_OPT_NONE), VVar10 != RD_OPT_NONE)) {
    enc->num_parts = 1;
  }
  VP8EncDspInit();
  VP8DefaultProbas(enc);
  iVar3 = enc->config->segments;
  (enc->segment_hdr).num_segments = iVar3;
  (enc->segment_hdr).update_map = (uint)(1 < iVar3);
  (enc->segment_hdr).size = 0;
  (enc->filter_hdr).simple = 1;
  (enc->filter_hdr).level = 0;
  (enc->filter_hdr).sharpness = 0;
  (enc->filter_hdr).i4x4_lf_delta = 0;
  puVar23 = enc->preds;
  iVar3 = enc->preds_w;
  for (lVar13 = -1; lVar13 < (long)enc->mb_w * 4; lVar13 = lVar13 + 1) {
    puVar23[lVar13 - iVar3] = '\0';
  }
  for (iVar3 = 0; iVar3 < enc->mb_h * 4; iVar3 = iVar3 + 1) {
    puVar23[(long)iVar3 * (long)enc->preds_w + -1] = '\0';
  }
  enc->nz[-1] = 0;
  VP8EncDspCostInit();
  VP8EncInitAlpha(enc);
  VP8TBufferInit(&enc->tokens,(int)((float)(iVar4 * 4) * ((config->quality * 5.0) / 100.0 + 1.0)));
  iVar3 = VP8EncAnalyze(enc);
  if (iVar3 != 0) {
    iVar3 = VP8EncStartAlpha(enc);
    if (enc->use_tokens == 0) {
      if (iVar3 != 0) {
        iVar3 = VP8EncLoop(enc);
        goto LAB_00120548;
      }
    }
    else if (iVar3 != 0) {
      iVar3 = VP8EncTokenLoop(enc);
LAB_00120548:
      if ((iVar3 != 0) && (iVar3 = VP8EncFinishAlpha(enc), iVar3 != 0)) {
        iVar3 = VP8EncWrite(enc);
        bVar25 = iVar3 != 0;
        goto LAB_0012056b;
      }
    }
  }
  bVar25 = false;
LAB_0012056b:
  pWVar1 = enc->pic->stats;
  if (pWVar1 != (WebPAuxStats *)0x0) {
    paiVar11 = enc->residual_bytes;
    paiVar14 = pWVar1->residual_bytes;
    for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
      pWVar1->segment_level[lVar13] = enc->dqm[lVar13].fstrength;
      pWVar1->segment_quant[lVar13] = enc->dqm[lVar13].quant;
      for (lVar18 = 0; lVar18 != 0x30; lVar18 = lVar18 + 0x10) {
        *(undefined4 *)((long)*paiVar14 + lVar18) = *(undefined4 *)((long)*paiVar11 + lVar18);
      }
      paiVar14 = (int (*) [4])(*paiVar14 + 1);
      paiVar11 = (int (*) [4])(*paiVar11 + 1);
    }
    uVar12 = enc->sse_count;
    dVar2 = GetPSNR(enc->sse[0],uVar12);
    pWVar1->PSNR[0] = (float)dVar2;
    dVar2 = GetPSNR(enc->sse[1],uVar12 >> 2);
    pWVar1->PSNR[1] = (float)dVar2;
    dVar2 = GetPSNR(enc->sse[2],uVar12 >> 2);
    pWVar1->PSNR[2] = (float)dVar2;
    dVar2 = GetPSNR(enc->sse[1] + enc->sse[0] + enc->sse[2],uVar12 * 3 >> 1);
    pWVar1->PSNR[3] = (float)dVar2;
    dVar2 = GetPSNR(enc->sse[3],uVar12);
    pWVar1->PSNR[4] = (float)dVar2;
    pWVar1->coded_size = enc->coded_size;
    for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
      pWVar1->block_count[lVar13] = enc->block_count[lVar13];
    }
  }
  if (bVar25 == false) {
    VP8EncFreeBitWriters(enc);
  }
  uVar7 = VP8EncDeleteAlpha(enc);
  VP8TBufferClear(&enc->tokens);
  WebPSafeFree(enc);
  return bVar25 & uVar7;
}

Assistant:

int WebPEncode(const WebPConfig* config, WebPPicture* pic) {
  int ok = 0;
  if (pic == NULL) return 0;

  pic->error_code = VP8_ENC_OK;  // all ok so far
  if (config == NULL) {  // bad params
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_NULL_PARAMETER);
  }
  if (!WebPValidateConfig(config)) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_INVALID_CONFIGURATION);
  }
  if (!WebPValidatePicture(pic)) return 0;
  if (pic->width > WEBP_MAX_DIMENSION || pic->height > WEBP_MAX_DIMENSION) {
    return WebPEncodingSetError(pic, VP8_ENC_ERROR_BAD_DIMENSION);
  }

  if (pic->stats != NULL) memset(pic->stats, 0, sizeof(*pic->stats));

  if (!config->lossless) {
    VP8Encoder* enc = NULL;

    if (pic->use_argb || pic->y == NULL || pic->u == NULL || pic->v == NULL) {
      // Make sure we have YUVA samples.
      if (config->use_sharp_yuv || (config->preprocessing & 4)) {
        if (!WebPPictureSharpARGBToYUVA(pic)) {
          return 0;
        }
      } else {
        float dithering = 0.f;
        if (config->preprocessing & 2) {
          const float x = config->quality / 100.f;
          const float x2 = x * x;
          // slowly decreasing from max dithering at low quality (q->0)
          // to 0.5 dithering amplitude at high quality (q->100)
          dithering = 1.0f + (0.5f - 1.0f) * x2 * x2;
        }
        if (!WebPPictureARGBToYUVADithered(pic, WEBP_YUV420, dithering)) {
          return 0;
        }
      }
    }

    if (!config->exact) {
      WebPCleanupTransparentArea(pic);
    }

    enc = InitVP8Encoder(config, pic);
    if (enc == NULL) return 0;  // pic->error is already set.
    // Note: each of the tasks below account for 20% in the progress report.
    ok = VP8EncAnalyze(enc);

    // Analysis is done, proceed to actual coding.
    ok = ok && VP8EncStartAlpha(enc);   // possibly done in parallel
    if (!enc->use_tokens) {
      ok = ok && VP8EncLoop(enc);
    } else {
      ok = ok && VP8EncTokenLoop(enc);
    }
    ok = ok && VP8EncFinishAlpha(enc);

    ok = ok && VP8EncWrite(enc);
    StoreStats(enc);
    if (!ok) {
      VP8EncFreeBitWriters(enc);
    }
    ok &= DeleteVP8Encoder(enc);  // must always be called, even if !ok
  } else {
    // Make sure we have ARGB samples.
    if (pic->argb == NULL && !WebPPictureYUVAToARGB(pic)) {
      return 0;
    }

    if (!config->exact) {
      WebPReplaceTransparentPixels(pic, 0x000000);
    }

    ok = VP8LEncodeImage(config, pic);  // Sets pic->error in case of problem.
  }

  return ok;
}